

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

size_t __thiscall OpenMesh::PropertyT<short>::size_of(PropertyT<short> *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar2;
  
  iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xc])();
  if (CONCAT44(extraout_var,iVar1) != -1) {
    iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])(this);
    sVar2 = BaseProperty::size_of(&this->super_BaseProperty,CONCAT44(extraout_var_00,iVar1));
    return sVar2;
  }
  return (long)(this->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start & 0xfffffffffffffffe;
}

Assistant:

virtual size_t size_of(void) const
  {
    if (element_size() != IO::UnknownSize)
      return this->BaseProperty::size_of(n_elements());
    return std::accumulate(data_.begin(), data_.end(), size_t(0), plus());
  }